

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.cpp
# Opt level: O2

void __thiscall Rational::normalize(Rational *this)

{
  BigInteger *a_00;
  bool bVar1;
  BigInteger a;
  BigInteger local_90;
  BigInteger local_70;
  BigInteger local_50;
  
  a_00 = &this->_denominator;
  BigInteger::BigInteger(&local_90,0);
  bVar1 = operator<(a_00,&local_90);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
  if (bVar1) {
    BigInteger::operator-(&local_90,a_00);
    BigInteger::operator=(a_00,&local_90);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
    BigInteger::operator-(&local_90,&this->_numerator);
    BigInteger::operator=(&this->_numerator,&local_90);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
  }
  abs((int)&local_50);
  BigInteger::BigInteger(&local_70,a_00);
  gcd(&local_90,&local_50,&local_70);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
  BigInteger::operator/=(&this->_numerator,&local_90);
  BigInteger::operator/=(a_00,&local_90);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
  return;
}

Assistant:

void Rational::normalize()
{
    if(_denominator < 0)
    {
        _denominator = -_denominator;
        _numerator = -_numerator;
    }
    BigInteger a = gcd(abs(_numerator), _denominator);
    _numerator /= a;
    _denominator /= a;
}